

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O3

void benchmark_logical_operations(void)

{
  uint64_t *puVar1;
  bool bVar2;
  __time_t _Var3;
  long lVar4;
  bitset_container_t *bitset;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int32_t iVar11;
  timespec ts;
  timespec local_58;
  bitset_container_t *local_48;
  bitset_container_t *local_40;
  bitset_container_t *local_38;
  
  puts("\nLogical operations (time units per single operation):");
  local_38 = bitset_container_create();
  puVar1 = local_38->words;
  iVar11 = local_38->cardinality;
  uVar8 = 0xfffffffd;
  do {
    uVar7 = (int)uVar8 + 3;
    uVar8 = (ulong)uVar7;
    uVar6 = puVar1[uVar7 >> 6];
    uVar10 = uVar6 | 1L << (uVar8 & 0x3f);
    iVar11 = iVar11 + (int)((uVar6 ^ uVar10) >> ((byte)uVar7 & 0x3f));
    puVar1[uVar7 >> 6] = uVar10;
  } while (uVar7 < 0xfffd);
  local_38->cardinality = iVar11;
  local_40 = bitset_container_create();
  puVar1 = local_40->words;
  iVar11 = local_40->cardinality;
  uVar8 = 0xfffffffb;
  do {
    uVar7 = (int)uVar8 + 5;
    uVar8 = (ulong)uVar7;
    uVar6 = puVar1[uVar7 >> 6];
    uVar10 = uVar6 | 1L << (uVar8 & 0x3f);
    iVar11 = iVar11 + (int)((uVar6 ^ uVar10) >> ((byte)uVar7 & 0x3f));
    puVar1[uVar7 >> 6] = uVar10;
  } while (uVar7 < 0xfffb);
  local_40->cardinality = iVar11;
  local_48 = bitset_container_create();
  bVar2 = false;
  printf("%s: ","bitset_container_and_nocard(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_and_nocard(local_38,local_40,local_48);
    if (iVar5 != -1) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_and(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_and(local_38,local_40,local_48);
    if (iVar5 != 0x1112) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_and_justcard(B1, B2)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_and_justcard(local_38,local_40);
    if (iVar5 != 0x1112) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(BO)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_compute_cardinality(local_48);
    if (iVar5 != 0x1112) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or_nocard(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_or_nocard(local_38,local_40,local_48);
    if (iVar5 != -1) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_or(local_38,local_40,local_48);
    if (iVar5 != 0x7778) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or_justcard(B1, B2)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_or_justcard(local_38,local_40);
    if (iVar5 != 0x7778) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar2 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(BO)");
  fflush((FILE *)0x0);
  iVar9 = 500;
  uVar8 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_58);
    lVar4 = local_58.tv_nsec;
    _Var3 = local_58.tv_sec;
    iVar5 = bitset_container_compute_cardinality(local_48);
    if (iVar5 != 0x7778) {
      bVar2 = true;
    }
    clock_gettime(3,&local_58);
    bitset = local_48;
    uVar6 = (local_58.tv_sec - _Var3) * 1000000000 + (local_58.tv_nsec - lVar4);
    if (uVar8 <= uVar6) {
      uVar6 = uVar8;
    }
    iVar9 = iVar9 + -1;
    uVar8 = uVar6;
  } while (iVar9 != 0);
  printf(" %.2f cycles per operation",(double)uVar6);
  if (bVar2) {
    printf(" [ERROR]");
  }
  putchar(10);
  fflush((FILE *)0x0);
  bitset_container_free(bitset);
  bitset_container_free(local_38);
  bitset_container_free(local_40);
  putchar(10);
  return;
}

Assistant:

void benchmark_logical_operations() {
    printf("\nLogical operations (time units per single operation):\n");
    bitset_container_t* B1 = bitset_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        bitset_container_set(B1, (uint16_t)x);
    }
    bitset_container_t* B2 = bitset_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        bitset_container_set(B2, (uint16_t)x);
    }

    bitset_container_t* BO = bitset_container_create();

    const int and_cardinality = DIV_CEIL_64K(3 * 5);
    BEST_TIME(bitset_container_and_nocard(B1, B2, BO),
              BITSET_UNKNOWN_CARDINALITY, repeat, 1);
    BEST_TIME(bitset_container_and(B1, B2, BO), and_cardinality, repeat, 1);
    BEST_TIME(bitset_container_and_justcard(B1, B2), and_cardinality, repeat,
              1);
    BEST_TIME(bitset_container_compute_cardinality(BO), and_cardinality, repeat,
              1);

    const int or_cardinality =
        DIV_CEIL_64K(3) + DIV_CEIL_64K(5) - DIV_CEIL_64K(3 * 5);
    BEST_TIME(bitset_container_or_nocard(B1, B2, BO),
              BITSET_UNKNOWN_CARDINALITY, repeat, 1);
    BEST_TIME(bitset_container_or(B1, B2, BO), or_cardinality, repeat, 1);
    BEST_TIME(bitset_container_or_justcard(B1, B2), or_cardinality, repeat, 1);
    BEST_TIME(bitset_container_compute_cardinality(BO), or_cardinality, repeat,
              1);

    bitset_container_free(BO);
    bitset_container_free(B1);
    bitset_container_free(B2);
    printf("\n");
}